

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O2

void __thiscall
amrex::STLtools::read_ascii_stl_file
          (STLtools *this,string *fname,Real scale,Array<Real,_3> *center,int reverse_normal)

{
  pointer pTVar1;
  Real RVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  Print *pPVar6;
  istream *piVar7;
  uint uVar8;
  long lVar9;
  pointer pTVar10;
  Real z;
  Real y;
  Real x;
  string tmp;
  undefined1 local_3c8 [400];
  ifstream is;
  ostream local_228 [16];
  byte abStack_218 [488];
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    iVar3 = Verbose();
    if (iVar3 != 0) {
      poVar4 = OutStream();
      Print::Print((Print *)&is,poVar4);
      std::operator<<(local_228,"Reading binary STL file ");
      std::operator<<(local_228,(string *)fname);
      std::operator<<(local_228,"\n");
      Print::~Print((Print *)&is);
    }
    std::ifstream::ifstream(&is,(string *)fname,_S_in);
    if (*(int *)(abStack_218 + *(long *)(_is + -0x18)) != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                     "STLtools::read_ascii_stl_file: failed to open ",fname);
      Abort((string *)local_3c8);
      std::__cxx11::string::~string((string *)local_3c8);
    }
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
    uVar8 = 0;
    while ((abStack_218[*(long *)(_is + -0x18)] & 2) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
      lVar5 = std::__cxx11::string::find((char *)&tmp,0x6230db);
      if (lVar5 != -1) break;
      uVar8 = uVar8 + 1;
    }
    iVar3 = (int)((ulong)uVar8 / 7);
    if (iVar3 * 7 != uVar8) {
      Abort_host("may be there are blank lines in the STL file\n");
    }
    this->m_num_tri = iVar3;
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (&this->m_tri_pts_h,(ulong)uVar8 / 7);
    pTVar10 = (this->m_tri_pts_h).m_data;
    iVar3 = Verbose();
    if (iVar3 != 0) {
      poVar4 = OutStream();
      Print::Print((Print *)local_3c8,poVar4);
      std::operator<<((ostream *)(local_3c8 + 0x10),"    Number of triangles: ");
      pPVar6 = Print::operator<<((Print *)local_3c8,&this->m_num_tri);
      std::operator<<((ostream *)&pPVar6->ss,"\n");
      Print::~Print((Print *)local_3c8);
    }
    std::istream::seekg(&is,0,0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
    for (lVar5 = 0; lVar5 < this->m_num_tri; lVar5 = lVar5 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
      for (lVar9 = 0; (int)lVar9 != 0x48; lVar9 = lVar9 + 0x18) {
        piVar7 = std::operator>>((istream *)&is,(string *)&tmp);
        piVar7 = std::istream::_M_extract<double>((double *)piVar7);
        piVar7 = std::istream::_M_extract<double>((double *)piVar7);
        std::istream::_M_extract<double>((double *)piVar7);
        *(double *)((long)&(pTVar10->v1).x + lVar9) = x * scale + center->_M_elems[0];
        *(double *)((long)&(pTVar10->v1).y + lVar9) = y * scale + center->_M_elems[1];
        *(double *)((long)&(pTVar10->v1).z + lVar9) = z * scale + center->_M_elems[2];
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&tmp);
      if (reverse_normal != 0) {
        pTVar1 = (this->m_tri_pts_h).m_data;
        local_3c8._16_8_ = pTVar1[lVar5].v1.z;
        local_3c8._0_8_ = pTVar1[lVar5].v1.x;
        local_3c8._8_8_ = pTVar1[lVar5].v1.y;
        RVar2 = pTVar1[lVar5].v2.y;
        pTVar1[lVar5].v1.x = pTVar1[lVar5].v2.x;
        pTVar1[lVar5].v1.y = RVar2;
        pTVar1[lVar5].v1.z = pTVar1[lVar5].v2.z;
        pTVar1[lVar5].v2.x = (Real)local_3c8._0_8_;
        pTVar1[lVar5].v2.y = (Real)local_3c8._8_8_;
        pTVar1[lVar5].v2.z = (Real)local_3c8._16_8_;
      }
      pTVar10 = (pointer)((long)&(pTVar10->v1).x + lVar9);
    }
    std::__cxx11::string::~string((string *)&tmp);
    std::ifstream::~ifstream(&is);
  }
  return;
}

Assistant:

void
STLtools::read_ascii_stl_file (std::string const& fname, Real scale,
                               Array<Real,3> const& center, int reverse_normal)
{
    if (ParallelDescriptor::IOProcessor()) {
        if (amrex::Verbose()) {
            Print() << "Reading binary STL file "<< fname << "\n";
        }

        std::ifstream is(fname, std::istringstream::in);
        if (!is.good()) {
            amrex::Abort("STLtools::read_ascii_stl_file: failed to open " + fname);
        }

        std::string tmp;
        int nlines=0;

        std::getline(is,tmp); //solid <solidname>
        while(!is.eof())
        {
            std::getline(is,tmp);
            if(tmp.find("endsolid")!=std::string::npos)
            {
                break;
            }
            nlines++;
        }

        constexpr int nlines_per_facet=7; //specific to ASCII STLs
        if(nlines%nlines_per_facet!=0)
        {
            Abort("may be there are blank lines in the STL file\n");
        }

        m_num_tri = nlines / nlines_per_facet;
        m_tri_pts_h.resize(m_num_tri);
        static_assert(sizeof(Triangle) == sizeof(Real)*9, "sizeof(Triangle) is wrong");
        Real* p = &(m_tri_pts_h[0].v1.x);

        if (amrex::Verbose()) {
            Print() << "    Number of triangles: " << m_num_tri << "\n";
        }

        is.seekg(0);
        std::getline(is,tmp); //solid <solidname>

        for(int i=0; i < m_num_tri; ++i)
        {
            std::getline(is,tmp); // facet normal
            std::getline(is,tmp); // outer loop

            Real x, y, z;

            for (int iv = 0; iv < 3; ++iv) { // 3 vertices
                is >> tmp >> x >> y >> z;
                *p++ = x * scale + center[0];
                *p++ = y * scale + center[1];
                *p++ = z * scale + center[2];
            }
            std::getline(is,tmp); // read \n

            std::getline(is,tmp); //end loop
            std::getline(is,tmp); //end facet

            if (reverse_normal) {
                std::swap(m_tri_pts_h[i].v1, m_tri_pts_h[i].v2);
            }
        }
    }
}